

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

int float64_le_quiet_m68k(float64 a,float64 b,float_status *status)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  
  if (status->flush_inputs_to_zero != '\0') {
    if ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
      a = a & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
    if ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
      b = b & 0x8000000000000000;
      status->float_exception_flags = status->float_exception_flags | 0x40;
    }
  }
  if (((~a & 0x7ff0000000000000) == 0 && (a & 0xfffffffffffff) != 0) ||
     ((b & 0xfffffffffffff) != 0 && (~b & 0x7ff0000000000000) == 0)) {
    if (((a & 0x7ff8000000000000) == 0x7ff0000000000000 && (a & 0x7ffffffffffff) != 0) ||
       ((b & 0x7ffffffffffff) != 0 && (b & 0x7ff8000000000000) == 0x7ff0000000000000)) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
    bVar1 = 0;
  }
  else {
    if ((long)(b ^ a) < 0) {
      bVar2 = (long)a < 0;
      bVar3 = ((b | a) & 0x7fffffffffffffff) == 0;
    }
    else {
      bVar2 = a == b;
      bVar3 = (long)a < 0 != a < b;
    }
    bVar1 = bVar3 | bVar2;
  }
  return (int)bVar1;
}

Assistant:

int float64_le_quiet(float64 a, float64 b, float_status *status)
{
    flag aSign, bSign;
    uint64_t av, bv;
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat64Sign( a );
    bSign = extractFloat64Sign( b );
    av = float64_val(a);
    bv = float64_val(b);
    if ( aSign != bSign ) return aSign || ( (uint64_t) ( ( av | bv )<<1 ) == 0 );
    return ( av == bv ) || ( aSign ^ ( av < bv ) );

}